

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DeleteSegdir(Fts3Table *p,int iLangid,int iIndex,int iLevel,Fts3SegReader **apSegment,
                    int nReader)

{
  sqlite3_stmt *psVar1;
  sqlite3_int64 sVar2;
  sqlite3_stmt *local_48;
  sqlite3_stmt *pDelete;
  int local_38;
  int i;
  int rc;
  int nReader_local;
  Fts3SegReader **apSegment_local;
  int local_20;
  int iLevel_local;
  int iIndex_local;
  int iLangid_local;
  Fts3Table *p_local;
  
  local_38 = 0;
  local_48 = (sqlite3_stmt *)0x0;
  i = nReader;
  _rc = apSegment;
  apSegment_local._4_4_ = iLevel;
  local_20 = iIndex;
  iLevel_local = iLangid;
  _iIndex_local = p;
  for (pDelete._4_4_ = 0; local_38 == 0 && pDelete._4_4_ < i; pDelete._4_4_ = pDelete._4_4_ + 1) {
    local_38 = fts3DeleteSegment(_iIndex_local,_rc[pDelete._4_4_]);
  }
  if (local_38 == 0) {
    if (apSegment_local._4_4_ == -2) {
      local_38 = fts3SqlStmt(_iIndex_local,0x1a,&local_48,(sqlite3_value **)0x0);
      psVar1 = local_48;
      if (local_38 == 0) {
        sVar2 = getAbsoluteLevel(_iIndex_local,iLevel_local,local_20,0);
        sqlite3_bind_int64(psVar1,1,sVar2);
        psVar1 = local_48;
        sVar2 = getAbsoluteLevel(_iIndex_local,iLevel_local,local_20,0x3ff);
        sqlite3_bind_int64(psVar1,2,sVar2);
      }
    }
    else {
      local_38 = fts3SqlStmt(_iIndex_local,0x10,&local_48,(sqlite3_value **)0x0);
      psVar1 = local_48;
      if (local_38 == 0) {
        sVar2 = getAbsoluteLevel(_iIndex_local,iLevel_local,local_20,apSegment_local._4_4_);
        sqlite3_bind_int64(psVar1,1,sVar2);
      }
    }
    if (local_38 == 0) {
      sqlite3_step(local_48);
      local_38 = sqlite3_reset(local_48);
    }
    p_local._4_4_ = local_38;
  }
  else {
    p_local._4_4_ = local_38;
  }
  return p_local._4_4_;
}

Assistant:

static int fts3DeleteSegdir(
  Fts3Table *p,                   /* Virtual table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index for p->aIndex */
  int iLevel,                     /* Level of %_segdir entries to delete */
  Fts3SegReader **apSegment,      /* Array of SegReader objects */
  int nReader                     /* Size of array apSegment */
){
  int rc = SQLITE_OK;             /* Return Code */
  int i;                          /* Iterator variable */
  sqlite3_stmt *pDelete = 0;      /* SQL statement to delete rows */

  for(i=0; rc==SQLITE_OK && i<nReader; i++){
    rc = fts3DeleteSegment(p, apSegment[i]);
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  assert( iLevel>=0 || iLevel==FTS3_SEGCURSOR_ALL );
  if( iLevel==FTS3_SEGCURSOR_ALL ){
    rc = fts3SqlStmt(p, SQL_DELETE_SEGDIR_RANGE, &pDelete, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDelete, 1, getAbsoluteLevel(p, iLangid, iIndex, 0));
      sqlite3_bind_int64(pDelete, 2, 
          getAbsoluteLevel(p, iLangid, iIndex, FTS3_SEGDIR_MAXLEVEL-1)
      );
    }
  }else{
    rc = fts3SqlStmt(p, SQL_DELETE_SEGDIR_LEVEL, &pDelete, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(
          pDelete, 1, getAbsoluteLevel(p, iLangid, iIndex, iLevel)
      );
    }
  }

  if( rc==SQLITE_OK ){
    sqlite3_step(pDelete);
    rc = sqlite3_reset(pDelete);
  }

  return rc;
}